

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1521.cpp
# Opt level: O0

int main(void)

{
  int x;
  istream *this;
  ostream *poVar1;
  int local_20;
  int pos;
  int i_1;
  int currPos;
  int i;
  int k;
  int n;
  
  k = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&i);
  std::istream::operator>>(this,&currPos);
  for (i_1 = 0; i_1 < i; i_1 = i_1 + 1) {
    update(i_1,1);
  }
  pos = currPos + -1;
  for (local_20 = 0; local_20 < i; local_20 = local_20 + 1) {
    x = find_kth(1,pos + 1);
    update(x,-1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x + 1);
    std::operator<<(poVar1," ");
    if (local_20 < i + -1) {
      pos = (pos + -1 + currPos) % ((i - local_20) + -1);
    }
  }
  return 0;
}

Assistant:

int main() {

    int n, k;
    std::cin >> n >> k;
    for (int i = 0; i < n; ++i) {
        update(i, 1);
//        for(int &item : t){
//            std::cout << item << " ";
//        }
//        std::cout << "\n";
    }
    int currPos = k - 1;
//    std::cout << "====================\n";

    for (int i = 0; i < n; ++i) {
        int pos = find_kth(1, currPos + 1);
        update(pos, -1);
//        for(int &item : t){
//            std::cout << item << " ";
//        }
//        std::cout << "\n";
        std::cout << pos + 1 << " ";
        if (i < n - 1)
            currPos = (currPos - 1 + k) % (n - i - 1);
    }
    return 0;
}